

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktBindingShaderAccessTests.cpp
# Opt level: O1

string * __thiscall
vkt::BindingModel::(anonymous_namespace)::ImageDescriptorCase::genResourceDeclarations_abi_cxx11_
          (string *__return_storage_ptr__,void *this,VkShaderStageFlagBits stage,int numUsedBindings
          )

{
  uint uVar1;
  int iVar2;
  long lVar3;
  undefined8 *puVar4;
  long *plVar5;
  ulong *puVar6;
  size_type *psVar7;
  char *pcVar8;
  ulong uVar9;
  string *psVar10;
  bool bVar11;
  string dimension;
  string dimensionBase;
  ostringstream s;
  string dimensionArray;
  long *local_348;
  undefined8 local_340;
  long local_338;
  undefined8 uStack_330;
  long *local_328;
  undefined8 local_320;
  long local_318;
  undefined8 uStack_310;
  ulong *local_308;
  long local_300;
  ulong local_2f8;
  long lStack_2f0;
  ulong *local_2e8;
  long local_2e0;
  ulong local_2d8;
  undefined8 uStack_2d0;
  ulong *local_2c8;
  long local_2c0;
  ulong local_2b8;
  long lStack_2b0;
  ulong *local_2a8;
  undefined8 local_2a0;
  ulong local_298;
  undefined8 uStack_290;
  ulong *local_288;
  long local_280;
  ulong local_278;
  long lStack_270;
  ulong *local_268;
  long local_260;
  ulong local_258 [2];
  long *local_248 [2];
  long local_238 [2];
  ulong *local_228 [2];
  ulong local_218 [2];
  ulong *local_208;
  long local_200;
  ulong local_1f8 [2];
  long *local_1e8;
  long local_1e0;
  long local_1d8 [2];
  allocator<char> local_1c8 [112];
  ios_base local_158 [264];
  long *local_50;
  long local_48;
  long local_40 [2];
  
  uVar1 = *(uint *)((long)this + 0x8c);
  if ((ulong)uVar1 < 6) {
    pcVar8 = &DAT_00b194ec + *(int *)(&DAT_00b194ec + (ulong)uVar1 * 4);
  }
  else {
    pcVar8 = (char *)0x0;
    if (uVar1 == 6) {
      pcVar8 = "Cube";
    }
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1e8,pcVar8,local_1c8);
  uVar1 = *(uint *)((long)this + 0x8c);
  if ((ulong)uVar1 < 6) {
    pcVar8 = &DAT_00b19504 + *(int *)(&DAT_00b19504 + (ulong)uVar1 * 4);
  }
  else {
    pcVar8 = (char *)0x0;
    if (uVar1 == 6) {
      pcVar8 = "CubeArray";
    }
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,pcVar8,local_1c8);
  uVar1 = *(uint *)((long)this + 0x8c);
  bVar11 = (uVar1 & 0xfffffffe) == 4;
  local_248[0] = local_238;
  psVar10 = (string *)&local_1e8;
  if (uVar1 == 6 || bVar11) {
    psVar10 = (string *)&local_50;
  }
  plVar5 = &local_1e0;
  if (uVar1 == 6 || bVar11) {
    plVar5 = &local_48;
  }
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_248,*(long *)psVar10,*plVar5 + *(long *)psVar10);
  iVar2 = *(int *)((long)this + 0x88);
  if (iVar2 - 1U < 2) {
    switch(*(undefined4 *)((long)this + 0x84)) {
    case 0:
      if (iVar2 == 1) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1c8);
        std::ostream::operator<<(local_1c8,numUsedBindings);
        std::__cxx11::stringbuf::str();
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1c8);
        std::ios_base::~ios_base(local_158);
        plVar5 = (long *)std::__cxx11::string::replace((ulong)local_228,0,(char *)0x0,0xb1b47c);
        local_288 = &local_278;
        puVar6 = (ulong *)(plVar5 + 2);
        if ((ulong *)*plVar5 == puVar6) {
          local_278 = *puVar6;
          lStack_270 = plVar5[3];
        }
        else {
          local_278 = *puVar6;
          local_288 = (ulong *)*plVar5;
        }
        local_280 = plVar5[1];
        *plVar5 = (long)puVar6;
        plVar5[1] = 0;
        *(undefined1 *)(plVar5 + 2) = 0;
        puVar4 = (undefined8 *)std::__cxx11::string::append((char *)&local_288);
        local_2c8 = &local_2b8;
        puVar6 = puVar4 + 2;
        if ((ulong *)*puVar4 == puVar6) {
          local_2b8 = *puVar6;
          lStack_2b0 = puVar4[3];
        }
        else {
          local_2b8 = *puVar6;
          local_2c8 = (ulong *)*puVar4;
        }
        local_2c0 = puVar4[1];
        *puVar4 = puVar6;
        puVar4[1] = 0;
        *(undefined1 *)(puVar4 + 2) = 0;
        puVar4 = (undefined8 *)
                 std::__cxx11::string::_M_append((char *)&local_2c8,(ulong)local_248[0]);
        puVar6 = puVar4 + 2;
        if ((ulong *)*puVar4 == puVar6) {
          local_298 = *puVar6;
          uStack_290 = puVar4[3];
          local_2a8 = &local_298;
        }
        else {
          local_298 = *puVar6;
          local_2a8 = (ulong *)*puVar4;
        }
        local_2a0 = puVar4[1];
        *puVar4 = puVar6;
        puVar4[1] = 0;
        *(undefined1 *)(puVar4 + 2) = 0;
        puVar4 = (undefined8 *)std::__cxx11::string::append((char *)&local_2a8);
        puVar6 = puVar4 + 2;
        if ((ulong *)*puVar4 == puVar6) {
          local_2d8 = *puVar6;
          uStack_2d0 = puVar4[3];
          local_2e8 = &local_2d8;
        }
        else {
          local_2d8 = *puVar6;
          local_2e8 = (ulong *)*puVar4;
        }
        local_2e0 = puVar4[1];
        *puVar4 = puVar6;
        puVar4[1] = 0;
        *(undefined1 *)(puVar4 + 2) = 0;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1c8);
        std::ostream::operator<<(local_1c8,numUsedBindings + 1);
        std::__cxx11::stringbuf::str();
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1c8);
        std::ios_base::~ios_base(local_158);
        uVar9 = 0xf;
        if (local_2e8 != &local_2d8) {
          uVar9 = local_2d8;
        }
        if (uVar9 < (ulong)(local_260 + local_2e0)) {
          uVar9 = 0xf;
          if (local_268 != local_258) {
            uVar9 = local_258[0];
          }
          if (uVar9 < (ulong)(local_260 + local_2e0)) goto LAB_0054397c;
          puVar4 = (undefined8 *)
                   std::__cxx11::string::replace((ulong)&local_268,0,(char *)0x0,(ulong)local_2e8);
        }
        else {
LAB_0054397c:
          puVar4 = (undefined8 *)
                   std::__cxx11::string::_M_append((char *)&local_2e8,(ulong)local_268);
        }
        local_348 = &local_338;
        plVar5 = puVar4 + 2;
        if ((long *)*puVar4 == plVar5) {
          local_338 = *plVar5;
          uStack_330 = puVar4[3];
        }
        else {
          local_338 = *plVar5;
          local_348 = (long *)*puVar4;
        }
        local_340 = puVar4[1];
        *puVar4 = plVar5;
        puVar4[1] = 0;
        *(undefined1 *)plVar5 = 0;
        puVar4 = (undefined8 *)std::__cxx11::string::append((char *)&local_348);
        puVar6 = puVar4 + 2;
        if ((ulong *)*puVar4 == puVar6) {
          local_2f8 = *puVar6;
          lStack_2f0 = puVar4[3];
          local_308 = &local_2f8;
        }
        else {
          local_2f8 = *puVar6;
          local_308 = (ulong *)*puVar4;
        }
        local_300 = puVar4[1];
        *puVar4 = puVar6;
        puVar4[1] = 0;
        *(undefined1 *)(puVar4 + 2) = 0;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1c8);
        std::ostream::operator<<(local_1c8,numUsedBindings + 2);
        std::__cxx11::stringbuf::str();
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1c8);
        std::ios_base::~ios_base(local_158);
        uVar9 = 0xf;
        if (local_308 != &local_2f8) {
          uVar9 = local_2f8;
        }
        if (uVar9 < (ulong)(local_200 + local_300)) {
          uVar9 = 0xf;
          if (local_208 != local_1f8) {
            uVar9 = local_1f8[0];
          }
          if (uVar9 < (ulong)(local_200 + local_300)) goto LAB_00543f61;
          puVar4 = (undefined8 *)
                   std::__cxx11::string::replace((ulong)&local_208,0,(char *)0x0,(ulong)local_308);
        }
        else {
LAB_00543f61:
          puVar4 = (undefined8 *)
                   std::__cxx11::string::_M_append((char *)&local_308,(ulong)local_208);
        }
        local_328 = &local_318;
        plVar5 = puVar4 + 2;
        if ((long *)*puVar4 == plVar5) {
          local_318 = *plVar5;
          uStack_310 = puVar4[3];
        }
        else {
          local_318 = *plVar5;
          local_328 = (long *)*puVar4;
        }
        local_320 = puVar4[1];
        *puVar4 = plVar5;
        puVar4[1] = 0;
        *(undefined1 *)plVar5 = 0;
        plVar5 = (long *)std::__cxx11::string::append((char *)&local_328);
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        psVar7 = (size_type *)(plVar5 + 2);
        if ((size_type *)*plVar5 == psVar7) {
          lVar3 = plVar5[3];
          (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar7;
          *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar3;
        }
        else {
          (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar5;
          (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar7;
        }
        __return_storage_ptr__->_M_string_length = plVar5[1];
        *plVar5 = (long)psVar7;
        plVar5[1] = 0;
        *(undefined1 *)(plVar5 + 2) = 0;
        if (local_328 != &local_318) {
          operator_delete(local_328,local_318 + 1);
        }
        if (local_208 != local_1f8) {
          operator_delete(local_208,local_1f8[0] + 1);
        }
        if (local_308 != &local_2f8) {
          operator_delete(local_308,local_2f8 + 1);
        }
        if (local_348 != &local_338) {
          operator_delete(local_348,local_338 + 1);
        }
        if (local_268 != local_258) {
          operator_delete(local_268,local_258[0] + 1);
        }
        if (local_2e8 != &local_2d8) {
          operator_delete(local_2e8,local_2d8 + 1);
        }
        local_258[0] = local_298;
        local_268 = local_2a8;
        if (local_2a8 != &local_298) {
LAB_00544260:
          operator_delete(local_268,local_258[0] + 1);
        }
      }
      else {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1c8);
        std::ostream::operator<<(local_1c8,numUsedBindings);
        std::__cxx11::stringbuf::str();
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1c8);
        std::ios_base::~ios_base(local_158);
        puVar4 = (undefined8 *)
                 std::__cxx11::string::replace((ulong)local_228,0,(char *)0x0,0xb1b47c);
        local_288 = &local_278;
        puVar6 = puVar4 + 2;
        if ((ulong *)*puVar4 == puVar6) {
          local_278 = *puVar6;
          lStack_270 = puVar4[3];
        }
        else {
          local_278 = *puVar6;
          local_288 = (ulong *)*puVar4;
        }
        local_280 = puVar4[1];
        *puVar4 = puVar6;
        puVar4[1] = 0;
        *(undefined1 *)(puVar4 + 2) = 0;
        puVar4 = (undefined8 *)std::__cxx11::string::append((char *)&local_288);
        puVar6 = puVar4 + 2;
        if ((ulong *)*puVar4 == puVar6) {
          local_2b8 = *puVar6;
          lStack_2b0 = puVar4[3];
          local_2c8 = &local_2b8;
        }
        else {
          local_2b8 = *puVar6;
          local_2c8 = (ulong *)*puVar4;
        }
        local_2c0 = puVar4[1];
        *puVar4 = puVar6;
        puVar4[1] = 0;
        *(undefined1 *)(puVar4 + 2) = 0;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1c8);
        std::ostream::operator<<(local_1c8,numUsedBindings + 1);
        std::__cxx11::stringbuf::str();
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1c8);
        std::ios_base::~ios_base(local_158);
        uVar9 = 0xf;
        if (local_2c8 != &local_2b8) {
          uVar9 = local_2b8;
        }
        if (uVar9 < (ulong)(local_260 + local_2c0)) {
          uVar9 = 0xf;
          if (local_268 != local_258) {
            uVar9 = local_258[0];
          }
          if (uVar9 < (ulong)(local_260 + local_2c0)) goto LAB_00543400;
          puVar4 = (undefined8 *)
                   std::__cxx11::string::replace((ulong)&local_268,0,(char *)0x0,(ulong)local_2c8);
        }
        else {
LAB_00543400:
          puVar4 = (undefined8 *)
                   std::__cxx11::string::_M_append((char *)&local_2c8,(ulong)local_268);
        }
        local_2a8 = &local_298;
        puVar6 = puVar4 + 2;
        if ((ulong *)*puVar4 == puVar6) {
          local_298 = *puVar6;
          uStack_290 = puVar4[3];
        }
        else {
          local_298 = *puVar6;
          local_2a8 = (ulong *)*puVar4;
        }
        local_2a0 = puVar4[1];
        *puVar4 = puVar6;
        puVar4[1] = 0;
        *(undefined1 *)puVar6 = 0;
        puVar4 = (undefined8 *)std::__cxx11::string::append((char *)&local_2a8);
        local_2e8 = &local_2d8;
        puVar6 = puVar4 + 2;
        if ((ulong *)*puVar4 == puVar6) {
          local_2d8 = *puVar6;
          uStack_2d0 = puVar4[3];
        }
        else {
          local_2d8 = *puVar6;
          local_2e8 = (ulong *)*puVar4;
        }
        local_2e0 = puVar4[1];
        *puVar4 = puVar6;
        puVar4[1] = 0;
        *(undefined1 *)(puVar4 + 2) = 0;
        puVar4 = (undefined8 *)
                 std::__cxx11::string::_M_append((char *)&local_2e8,(ulong)local_248[0]);
        plVar5 = puVar4 + 2;
        if ((long *)*puVar4 == plVar5) {
          local_338 = *plVar5;
          uStack_330 = puVar4[3];
          local_348 = &local_338;
        }
        else {
          local_338 = *plVar5;
          local_348 = (long *)*puVar4;
        }
        local_340 = puVar4[1];
        *puVar4 = plVar5;
        puVar4[1] = 0;
        *(undefined1 *)(puVar4 + 2) = 0;
        puVar4 = (undefined8 *)std::__cxx11::string::append((char *)&local_348);
        puVar6 = puVar4 + 2;
        if ((ulong *)*puVar4 == puVar6) {
          local_2f8 = *puVar6;
          lStack_2f0 = puVar4[3];
          local_308 = &local_2f8;
        }
        else {
          local_2f8 = *puVar6;
          local_308 = (ulong *)*puVar4;
        }
        local_300 = puVar4[1];
        *puVar4 = puVar6;
        puVar4[1] = 0;
        *(undefined1 *)(puVar4 + 2) = 0;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1c8);
        std::ostream::operator<<(local_1c8,numUsedBindings + 2);
        std::__cxx11::stringbuf::str();
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1c8);
        std::ios_base::~ios_base(local_158);
        uVar9 = 0xf;
        if (local_308 != &local_2f8) {
          uVar9 = local_2f8;
        }
        if (uVar9 < (ulong)(local_200 + local_300)) {
          uVar9 = 0xf;
          if (local_208 != local_1f8) {
            uVar9 = local_1f8[0];
          }
          if (uVar9 < (ulong)(local_200 + local_300)) goto LAB_00543bac;
          puVar4 = (undefined8 *)
                   std::__cxx11::string::replace((ulong)&local_208,0,(char *)0x0,(ulong)local_308);
        }
        else {
LAB_00543bac:
          puVar4 = (undefined8 *)
                   std::__cxx11::string::_M_append((char *)&local_308,(ulong)local_208);
        }
        local_328 = &local_318;
        plVar5 = puVar4 + 2;
        if ((long *)*puVar4 == plVar5) {
          local_318 = *plVar5;
          uStack_310 = puVar4[3];
        }
        else {
          local_318 = *plVar5;
          local_328 = (long *)*puVar4;
        }
        local_320 = puVar4[1];
        *puVar4 = plVar5;
        puVar4[1] = 0;
        *(undefined1 *)plVar5 = 0;
        plVar5 = (long *)std::__cxx11::string::append((char *)&local_328);
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        psVar7 = (size_type *)(plVar5 + 2);
        if ((size_type *)*plVar5 == psVar7) {
          lVar3 = plVar5[3];
          (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar7;
          *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar3;
        }
        else {
          (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar5;
          (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar7;
        }
        __return_storage_ptr__->_M_string_length = plVar5[1];
        *plVar5 = (long)psVar7;
        plVar5[1] = 0;
        *(undefined1 *)(plVar5 + 2) = 0;
        if (local_328 != &local_318) {
          operator_delete(local_328,local_318 + 1);
        }
        if (local_208 != local_1f8) {
          operator_delete(local_208,local_1f8[0] + 1);
        }
        if (local_308 != &local_2f8) {
          operator_delete(local_308,local_2f8 + 1);
        }
        if (local_348 != &local_338) {
          operator_delete(local_348,local_338 + 1);
        }
        if (local_2e8 != &local_2d8) {
          operator_delete(local_2e8,local_2d8 + 1);
        }
        if (local_2a8 != &local_298) {
          operator_delete(local_2a8,local_298 + 1);
        }
        if (local_268 != local_258) goto LAB_00544260;
      }
      if (local_2c8 != &local_2b8) goto LAB_00542b82;
      goto LAB_00542b92;
    case 1:
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1c8);
      std::ostream::operator<<(local_1c8,numUsedBindings);
      std::__cxx11::stringbuf::str();
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1c8);
      std::ios_base::~ios_base(local_158);
      puVar4 = (undefined8 *)std::__cxx11::string::replace((ulong)local_228,0,(char *)0x0,0xb1b47c);
      local_288 = &local_278;
      puVar6 = puVar4 + 2;
      if ((ulong *)*puVar4 == puVar6) {
        local_278 = *puVar6;
        lStack_270 = puVar4[3];
      }
      else {
        local_278 = *puVar6;
        local_288 = (ulong *)*puVar4;
      }
      local_280 = puVar4[1];
      *puVar4 = puVar6;
      puVar4[1] = 0;
      *(undefined1 *)(puVar4 + 2) = 0;
      puVar4 = (undefined8 *)std::__cxx11::string::append((char *)&local_288);
      local_2c8 = &local_2b8;
      puVar6 = puVar4 + 2;
      if ((ulong *)*puVar4 == puVar6) {
        local_2b8 = *puVar6;
        lStack_2b0 = puVar4[3];
      }
      else {
        local_2b8 = *puVar6;
        local_2c8 = (ulong *)*puVar4;
      }
      local_2c0 = puVar4[1];
      *puVar4 = puVar6;
      puVar4[1] = 0;
      *(undefined1 *)(puVar4 + 2) = 0;
      puVar4 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_2c8,(ulong)local_248[0])
      ;
      local_2a8 = &local_298;
      puVar6 = puVar4 + 2;
      if ((ulong *)*puVar4 == puVar6) {
        local_298 = *puVar6;
        uStack_290 = puVar4[3];
      }
      else {
        local_298 = *puVar6;
        local_2a8 = (ulong *)*puVar4;
      }
      local_2a0 = puVar4[1];
      *puVar4 = puVar6;
      puVar4[1] = 0;
      *(undefined1 *)(puVar4 + 2) = 0;
      puVar4 = (undefined8 *)std::__cxx11::string::append((char *)&local_2a8);
      puVar6 = puVar4 + 2;
      if ((ulong *)*puVar4 == puVar6) {
        local_2d8 = *puVar6;
        uStack_2d0 = puVar4[3];
        local_2e8 = &local_2d8;
      }
      else {
        local_2d8 = *puVar6;
        local_2e8 = (ulong *)*puVar4;
      }
      local_2e0 = puVar4[1];
      *puVar4 = puVar6;
      puVar4[1] = 0;
      *(undefined1 *)(puVar4 + 2) = 0;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1c8);
      std::ostream::operator<<(local_1c8,numUsedBindings + 1);
      std::__cxx11::stringbuf::str();
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1c8);
      std::ios_base::~ios_base(local_158);
      uVar9 = 0xf;
      if (local_2e8 != &local_2d8) {
        uVar9 = local_2d8;
      }
      if (uVar9 < (ulong)(local_260 + local_2e0)) {
        uVar9 = 0xf;
        if (local_268 != local_258) {
          uVar9 = local_258[0];
        }
        if (uVar9 < (ulong)(local_260 + local_2e0)) goto LAB_00542716;
        puVar4 = (undefined8 *)
                 std::__cxx11::string::replace((ulong)&local_268,0,(char *)0x0,(ulong)local_2e8);
      }
      else {
LAB_00542716:
        puVar4 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_2e8,(ulong)local_268);
      }
      local_348 = &local_338;
      plVar5 = puVar4 + 2;
      if ((long *)*puVar4 == plVar5) {
        local_338 = *plVar5;
        uStack_330 = puVar4[3];
      }
      else {
        local_338 = *plVar5;
        local_348 = (long *)*puVar4;
      }
      local_340 = puVar4[1];
      *puVar4 = plVar5;
      puVar4[1] = 0;
      *(undefined1 *)plVar5 = 0;
      puVar4 = (undefined8 *)std::__cxx11::string::append((char *)&local_348);
      local_308 = &local_2f8;
      puVar6 = puVar4 + 2;
      if ((ulong *)*puVar4 == puVar6) {
        local_2f8 = *puVar6;
        lStack_2f0 = puVar4[3];
      }
      else {
        local_2f8 = *puVar6;
        local_308 = (ulong *)*puVar4;
      }
      local_300 = puVar4[1];
      *puVar4 = puVar6;
      puVar4[1] = 0;
      *(undefined1 *)(puVar4 + 2) = 0;
      puVar4 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_308,(ulong)local_248[0])
      ;
      local_328 = &local_318;
      plVar5 = puVar4 + 2;
      if ((long *)*puVar4 == plVar5) {
        local_318 = *plVar5;
        uStack_310 = puVar4[3];
      }
      else {
        local_318 = *plVar5;
        local_328 = (long *)*puVar4;
      }
      local_320 = puVar4[1];
      *puVar4 = plVar5;
      puVar4[1] = 0;
      *(undefined1 *)(puVar4 + 2) = 0;
      plVar5 = (long *)std::__cxx11::string::append((char *)&local_328);
      break;
    case 2:
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1c8);
      std::ostream::operator<<(local_1c8,numUsedBindings);
      std::__cxx11::stringbuf::str();
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1c8);
      std::ios_base::~ios_base(local_158);
      puVar4 = (undefined8 *)std::__cxx11::string::replace((ulong)local_228,0,(char *)0x0,0xb1b47c);
      local_288 = &local_278;
      puVar6 = puVar4 + 2;
      if ((ulong *)*puVar4 == puVar6) {
        local_278 = *puVar6;
        lStack_270 = puVar4[3];
      }
      else {
        local_278 = *puVar6;
        local_288 = (ulong *)*puVar4;
      }
      local_280 = puVar4[1];
      *puVar4 = puVar6;
      puVar4[1] = 0;
      *(undefined1 *)(puVar4 + 2) = 0;
      plVar5 = (long *)std::__cxx11::string::append((char *)&local_288);
      local_2c8 = &local_2b8;
      puVar6 = (ulong *)(plVar5 + 2);
      if ((ulong *)*plVar5 == puVar6) {
        local_2b8 = *puVar6;
        lStack_2b0 = plVar5[3];
      }
      else {
        local_2b8 = *puVar6;
        local_2c8 = (ulong *)*plVar5;
      }
      local_2c0 = plVar5[1];
      *plVar5 = (long)puVar6;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      puVar4 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_2c8,(ulong)local_1e8);
      local_2a8 = &local_298;
      puVar6 = puVar4 + 2;
      if ((ulong *)*puVar4 == puVar6) {
        local_298 = *puVar6;
        uStack_290 = puVar4[3];
      }
      else {
        local_298 = *puVar6;
        local_2a8 = (ulong *)*puVar4;
      }
      local_2a0 = puVar4[1];
      *puVar4 = puVar6;
      puVar4[1] = 0;
      *(undefined1 *)(puVar4 + 2) = 0;
      puVar4 = (undefined8 *)std::__cxx11::string::append((char *)&local_2a8);
      puVar6 = puVar4 + 2;
      if ((ulong *)*puVar4 == puVar6) {
        local_2d8 = *puVar6;
        uStack_2d0 = puVar4[3];
        local_2e8 = &local_2d8;
      }
      else {
        local_2d8 = *puVar6;
        local_2e8 = (ulong *)*puVar4;
      }
      local_2e0 = puVar4[1];
      *puVar4 = puVar6;
      puVar4[1] = 0;
      *(undefined1 *)(puVar4 + 2) = 0;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1c8);
      std::ostream::operator<<(local_1c8,numUsedBindings + 1);
      std::__cxx11::stringbuf::str();
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1c8);
      std::ios_base::~ios_base(local_158);
      uVar9 = 0xf;
      if (local_2e8 != &local_2d8) {
        uVar9 = local_2d8;
      }
      if (uVar9 < (ulong)(local_260 + local_2e0)) {
        uVar9 = 0xf;
        if (local_268 != local_258) {
          uVar9 = local_258[0];
        }
        if (uVar9 < (ulong)(local_260 + local_2e0)) goto LAB_00542562;
        puVar4 = (undefined8 *)
                 std::__cxx11::string::replace((ulong)&local_268,0,(char *)0x0,(ulong)local_2e8);
      }
      else {
LAB_00542562:
        puVar4 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_2e8,(ulong)local_268);
      }
      local_348 = &local_338;
      plVar5 = puVar4 + 2;
      if ((long *)*puVar4 == plVar5) {
        local_338 = *plVar5;
        uStack_330 = puVar4[3];
      }
      else {
        local_338 = *plVar5;
        local_348 = (long *)*puVar4;
      }
      local_340 = puVar4[1];
      *puVar4 = plVar5;
      puVar4[1] = 0;
      *(undefined1 *)plVar5 = 0;
      plVar5 = (long *)std::__cxx11::string::append((char *)&local_348);
      local_308 = &local_2f8;
      puVar6 = (ulong *)(plVar5 + 2);
      if ((ulong *)*plVar5 == puVar6) {
        local_2f8 = *puVar6;
        lStack_2f0 = plVar5[3];
      }
      else {
        local_2f8 = *puVar6;
        local_308 = (ulong *)*plVar5;
      }
      local_300 = plVar5[1];
      *plVar5 = (long)puVar6;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      puVar4 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_308,(ulong)local_1e8);
      local_328 = &local_318;
      plVar5 = puVar4 + 2;
      if ((long *)*puVar4 == plVar5) {
        local_318 = *plVar5;
        uStack_310 = puVar4[3];
      }
      else {
        local_318 = *plVar5;
        local_328 = (long *)*puVar4;
      }
      local_320 = puVar4[1];
      *puVar4 = plVar5;
      puVar4[1] = 0;
      *(undefined1 *)(puVar4 + 2) = 0;
      plVar5 = (long *)std::__cxx11::string::append((char *)&local_328);
      break;
    case 3:
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1c8);
      std::ostream::operator<<(local_1c8,numUsedBindings);
      std::__cxx11::stringbuf::str();
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1c8);
      std::ios_base::~ios_base(local_158);
      puVar4 = (undefined8 *)std::__cxx11::string::replace((ulong)local_228,0,(char *)0x0,0xb1b47c);
      local_288 = &local_278;
      puVar6 = puVar4 + 2;
      if ((ulong *)*puVar4 == puVar6) {
        local_278 = *puVar6;
        lStack_270 = puVar4[3];
      }
      else {
        local_278 = *puVar6;
        local_288 = (ulong *)*puVar4;
      }
      local_280 = puVar4[1];
      *puVar4 = puVar6;
      puVar4[1] = 0;
      *(undefined1 *)(puVar4 + 2) = 0;
      puVar4 = (undefined8 *)std::__cxx11::string::append((char *)&local_288);
      local_2c8 = &local_2b8;
      puVar6 = puVar4 + 2;
      if ((ulong *)*puVar4 == puVar6) {
        local_2b8 = *puVar6;
        lStack_2b0 = puVar4[3];
      }
      else {
        local_2b8 = *puVar6;
        local_2c8 = (ulong *)*puVar4;
      }
      local_2c0 = puVar4[1];
      *puVar4 = puVar6;
      puVar4[1] = 0;
      *(undefined1 *)(puVar4 + 2) = 0;
      puVar4 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_2c8,(ulong)local_248[0])
      ;
      local_2a8 = &local_298;
      puVar6 = puVar4 + 2;
      if ((ulong *)*puVar4 == puVar6) {
        local_298 = *puVar6;
        uStack_290 = puVar4[3];
      }
      else {
        local_298 = *puVar6;
        local_2a8 = (ulong *)*puVar4;
      }
      local_2a0 = puVar4[1];
      *puVar4 = puVar6;
      puVar4[1] = 0;
      *(undefined1 *)(puVar4 + 2) = 0;
      puVar4 = (undefined8 *)std::__cxx11::string::append((char *)&local_2a8);
      puVar6 = puVar4 + 2;
      if ((ulong *)*puVar4 == puVar6) {
        local_2d8 = *puVar6;
        uStack_2d0 = puVar4[3];
        local_2e8 = &local_2d8;
      }
      else {
        local_2d8 = *puVar6;
        local_2e8 = (ulong *)*puVar4;
      }
      local_2e0 = puVar4[1];
      *puVar4 = puVar6;
      puVar4[1] = 0;
      *(undefined1 *)(puVar4 + 2) = 0;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1c8);
      std::ostream::operator<<(local_1c8,numUsedBindings + 1);
      std::__cxx11::stringbuf::str();
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1c8);
      std::ios_base::~ios_base(local_158);
      uVar9 = 0xf;
      if (local_2e8 != &local_2d8) {
        uVar9 = local_2d8;
      }
      if (uVar9 < (ulong)(local_260 + local_2e0)) {
        uVar9 = 0xf;
        if (local_268 != local_258) {
          uVar9 = local_258[0];
        }
        if (uVar9 < (ulong)(local_260 + local_2e0)) goto LAB_0054263c;
        puVar4 = (undefined8 *)
                 std::__cxx11::string::replace((ulong)&local_268,0,(char *)0x0,(ulong)local_2e8);
      }
      else {
LAB_0054263c:
        puVar4 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_2e8,(ulong)local_268);
      }
      local_348 = &local_338;
      plVar5 = puVar4 + 2;
      if ((long *)*puVar4 == plVar5) {
        local_338 = *plVar5;
        uStack_330 = puVar4[3];
      }
      else {
        local_338 = *plVar5;
        local_348 = (long *)*puVar4;
      }
      local_340 = puVar4[1];
      *puVar4 = plVar5;
      puVar4[1] = 0;
      *(undefined1 *)plVar5 = 0;
      puVar4 = (undefined8 *)std::__cxx11::string::append((char *)&local_348);
      local_308 = &local_2f8;
      puVar6 = puVar4 + 2;
      if ((ulong *)*puVar4 == puVar6) {
        local_2f8 = *puVar6;
        lStack_2f0 = puVar4[3];
      }
      else {
        local_2f8 = *puVar6;
        local_308 = (ulong *)*puVar4;
      }
      local_300 = puVar4[1];
      *puVar4 = puVar6;
      puVar4[1] = 0;
      *(undefined1 *)(puVar4 + 2) = 0;
      puVar4 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_308,(ulong)local_248[0])
      ;
      local_328 = &local_318;
      plVar5 = puVar4 + 2;
      if ((long *)*puVar4 == plVar5) {
        local_318 = *plVar5;
        uStack_310 = puVar4[3];
      }
      else {
        local_318 = *plVar5;
        local_328 = (long *)*puVar4;
      }
      local_320 = puVar4[1];
      *puVar4 = plVar5;
      puVar4[1] = 0;
      *(undefined1 *)(puVar4 + 2) = 0;
      plVar5 = (long *)std::__cxx11::string::append((char *)&local_328);
      break;
    default:
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
      goto LAB_00543d9c;
    }
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    psVar7 = (size_type *)(plVar5 + 2);
    if ((size_type *)*plVar5 == psVar7) {
      lVar3 = plVar5[3];
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar7;
      *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar3;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar5;
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar7;
    }
    __return_storage_ptr__->_M_string_length = plVar5[1];
    *plVar5 = (long)psVar7;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    if (local_328 != &local_318) {
      operator_delete(local_328,local_318 + 1);
    }
    if (local_308 != &local_2f8) {
      operator_delete(local_308,local_2f8 + 1);
    }
    if (local_348 != &local_338) {
      operator_delete(local_348,local_338 + 1);
    }
    if (local_268 != local_258) {
      operator_delete(local_268,local_258[0] + 1);
    }
    if (local_2e8 != &local_2d8) {
      operator_delete(local_2e8,local_2d8 + 1);
    }
    if (local_2a8 != &local_298) {
      operator_delete(local_2a8,local_298 + 1);
    }
    if (local_2c8 != &local_2b8) {
LAB_00542b82:
      operator_delete(local_2c8,local_2b8 + 1);
    }
LAB_00542b92:
    if (local_288 != &local_278) {
      operator_delete(local_288,local_278 + 1);
    }
    if (local_228[0] == local_218) goto LAB_00543d9c;
  }
  else {
    if (iVar2 != 0) {
      if (iVar2 != 3) {
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
        goto LAB_00543d9c;
      }
      switch(*(undefined4 *)((long)this + 0x84)) {
      case 0:
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1c8);
        std::ostream::operator<<(local_1c8,numUsedBindings);
        std::__cxx11::stringbuf::str();
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1c8);
        std::ios_base::~ios_base(local_158);
        puVar4 = (undefined8 *)
                 std::__cxx11::string::replace((ulong)&local_2c8,0,(char *)0x0,0xb1b47c);
        local_2a8 = &local_298;
        puVar6 = puVar4 + 2;
        if ((ulong *)*puVar4 == puVar6) {
          local_298 = *puVar6;
          uStack_290 = puVar4[3];
        }
        else {
          local_298 = *puVar6;
          local_2a8 = (ulong *)*puVar4;
        }
        local_2a0 = puVar4[1];
        *puVar4 = puVar6;
        puVar4[1] = 0;
        *(undefined1 *)(puVar4 + 2) = 0;
        puVar4 = (undefined8 *)std::__cxx11::string::append((char *)&local_2a8);
        local_2e8 = &local_2d8;
        puVar6 = puVar4 + 2;
        if ((ulong *)*puVar4 == puVar6) {
          local_2d8 = *puVar6;
          uStack_2d0 = puVar4[3];
        }
        else {
          local_2d8 = *puVar6;
          local_2e8 = (ulong *)*puVar4;
        }
        local_2e0 = puVar4[1];
        *puVar4 = puVar6;
        puVar4[1] = 0;
        *(undefined1 *)(puVar4 + 2) = 0;
        puVar4 = (undefined8 *)
                 std::__cxx11::string::_M_append((char *)&local_2e8,(ulong)local_248[0]);
        local_348 = &local_338;
        plVar5 = puVar4 + 2;
        if ((long *)*puVar4 == plVar5) {
          local_338 = *plVar5;
          uStack_330 = puVar4[3];
        }
        else {
          local_338 = *plVar5;
          local_348 = (long *)*puVar4;
        }
        local_340 = puVar4[1];
        *puVar4 = plVar5;
        puVar4[1] = 0;
        *(undefined1 *)(puVar4 + 2) = 0;
        puVar4 = (undefined8 *)std::__cxx11::string::append((char *)&local_348);
        puVar6 = puVar4 + 2;
        if ((ulong *)*puVar4 == puVar6) {
          local_2f8 = *puVar6;
          lStack_2f0 = puVar4[3];
          local_308 = &local_2f8;
        }
        else {
          local_2f8 = *puVar6;
          local_308 = (ulong *)*puVar4;
        }
        local_300 = puVar4[1];
        *puVar4 = puVar6;
        puVar4[1] = 0;
        *(undefined1 *)(puVar4 + 2) = 0;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1c8);
        std::ostream::operator<<(local_1c8,numUsedBindings + 1);
        std::__cxx11::stringbuf::str();
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1c8);
        std::ios_base::~ios_base(local_158);
        uVar9 = 0xf;
        if (local_308 != &local_2f8) {
          uVar9 = local_2f8;
        }
        if (uVar9 < (ulong)(local_280 + local_300)) {
          uVar9 = 0xf;
          if (local_288 != &local_278) {
            uVar9 = local_278;
          }
          if (uVar9 < (ulong)(local_280 + local_300)) goto LAB_005437ca;
          puVar4 = (undefined8 *)
                   std::__cxx11::string::replace((ulong)&local_288,0,(char *)0x0,(ulong)local_308);
        }
        else {
LAB_005437ca:
          puVar4 = (undefined8 *)
                   std::__cxx11::string::_M_append((char *)&local_308,(ulong)local_288);
        }
        local_328 = &local_318;
        plVar5 = puVar4 + 2;
        if ((long *)*puVar4 == plVar5) {
          local_318 = *plVar5;
          uStack_310 = puVar4[3];
        }
        else {
          local_318 = *plVar5;
          local_328 = (long *)*puVar4;
        }
        local_320 = puVar4[1];
        *puVar4 = plVar5;
        puVar4[1] = 0;
        *(undefined1 *)plVar5 = 0;
        plVar5 = (long *)std::__cxx11::string::append((char *)&local_328);
        goto LAB_00543c97;
      case 1:
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1c8);
        std::ostream::operator<<(local_1c8,numUsedBindings);
        std::__cxx11::stringbuf::str();
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1c8);
        std::ios_base::~ios_base(local_158);
        puVar4 = (undefined8 *)
                 std::__cxx11::string::replace((ulong)&local_2e8,0,(char *)0x0,0xb1b47c);
        local_348 = &local_338;
        plVar5 = puVar4 + 2;
        if ((long *)*puVar4 == plVar5) {
          local_338 = *plVar5;
          uStack_330 = puVar4[3];
        }
        else {
          local_338 = *plVar5;
          local_348 = (long *)*puVar4;
        }
        local_340 = puVar4[1];
        *puVar4 = plVar5;
        puVar4[1] = 0;
        *(undefined1 *)(puVar4 + 2) = 0;
        puVar4 = (undefined8 *)std::__cxx11::string::append((char *)&local_348);
        local_308 = &local_2f8;
        puVar6 = puVar4 + 2;
        if ((ulong *)*puVar4 == puVar6) {
          local_2f8 = *puVar6;
          lStack_2f0 = puVar4[3];
        }
        else {
          local_2f8 = *puVar6;
          local_308 = (ulong *)*puVar4;
        }
        local_300 = puVar4[1];
        *puVar4 = puVar6;
        puVar4[1] = 0;
        *(undefined1 *)(puVar4 + 2) = 0;
        puVar4 = (undefined8 *)
                 std::__cxx11::string::_M_append((char *)&local_308,(ulong)local_248[0]);
        local_328 = &local_318;
        plVar5 = puVar4 + 2;
        if ((long *)*puVar4 == plVar5) {
          local_318 = *plVar5;
          uStack_310 = puVar4[3];
        }
        else {
          local_318 = *plVar5;
          local_328 = (long *)*puVar4;
        }
        local_320 = puVar4[1];
        *puVar4 = plVar5;
        puVar4[1] = 0;
        *(undefined1 *)(puVar4 + 2) = 0;
        plVar5 = (long *)std::__cxx11::string::append((char *)&local_328);
        break;
      case 2:
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1c8);
        std::ostream::operator<<(local_1c8,numUsedBindings);
        std::__cxx11::stringbuf::str();
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1c8);
        std::ios_base::~ios_base(local_158);
        puVar4 = (undefined8 *)
                 std::__cxx11::string::replace((ulong)&local_2e8,0,(char *)0x0,0xb1b47c);
        local_348 = &local_338;
        plVar5 = puVar4 + 2;
        if ((long *)*puVar4 == plVar5) {
          local_338 = *plVar5;
          uStack_330 = puVar4[3];
        }
        else {
          local_338 = *plVar5;
          local_348 = (long *)*puVar4;
        }
        local_340 = puVar4[1];
        *puVar4 = plVar5;
        puVar4[1] = 0;
        *(undefined1 *)(puVar4 + 2) = 0;
        puVar4 = (undefined8 *)std::__cxx11::string::append((char *)&local_348);
        local_308 = &local_2f8;
        puVar6 = puVar4 + 2;
        if ((ulong *)*puVar4 == puVar6) {
          local_2f8 = *puVar6;
          lStack_2f0 = puVar4[3];
        }
        else {
          local_2f8 = *puVar6;
          local_308 = (ulong *)*puVar4;
        }
        local_300 = puVar4[1];
        *puVar4 = puVar6;
        puVar4[1] = 0;
        *(undefined1 *)(puVar4 + 2) = 0;
        puVar4 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_308,(ulong)local_1e8);
        local_328 = &local_318;
        plVar5 = puVar4 + 2;
        if ((long *)*puVar4 == plVar5) {
          local_318 = *plVar5;
          uStack_310 = puVar4[3];
        }
        else {
          local_318 = *plVar5;
          local_328 = (long *)*puVar4;
        }
        local_320 = puVar4[1];
        *puVar4 = plVar5;
        puVar4[1] = 0;
        *(undefined1 *)(puVar4 + 2) = 0;
        plVar5 = (long *)std::__cxx11::string::append((char *)&local_328);
        break;
      case 3:
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1c8);
        std::ostream::operator<<(local_1c8,numUsedBindings);
        std::__cxx11::stringbuf::str();
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1c8);
        std::ios_base::~ios_base(local_158);
        puVar4 = (undefined8 *)
                 std::__cxx11::string::replace((ulong)&local_2e8,0,(char *)0x0,0xb1b47c);
        local_348 = &local_338;
        plVar5 = puVar4 + 2;
        if ((long *)*puVar4 == plVar5) {
          local_338 = *plVar5;
          uStack_330 = puVar4[3];
        }
        else {
          local_338 = *plVar5;
          local_348 = (long *)*puVar4;
        }
        local_340 = puVar4[1];
        *puVar4 = plVar5;
        puVar4[1] = 0;
        *(undefined1 *)(puVar4 + 2) = 0;
        puVar4 = (undefined8 *)std::__cxx11::string::append((char *)&local_348);
        local_308 = &local_2f8;
        puVar6 = puVar4 + 2;
        if ((ulong *)*puVar4 == puVar6) {
          local_2f8 = *puVar6;
          lStack_2f0 = puVar4[3];
        }
        else {
          local_2f8 = *puVar6;
          local_308 = (ulong *)*puVar4;
        }
        local_300 = puVar4[1];
        *puVar4 = puVar6;
        puVar4[1] = 0;
        *(undefined1 *)(puVar4 + 2) = 0;
        puVar4 = (undefined8 *)
                 std::__cxx11::string::_M_append((char *)&local_308,(ulong)local_248[0]);
        local_328 = &local_318;
        plVar5 = puVar4 + 2;
        if ((long *)*puVar4 == plVar5) {
          local_318 = *plVar5;
          uStack_310 = puVar4[3];
        }
        else {
          local_318 = *plVar5;
          local_328 = (long *)*puVar4;
        }
        local_320 = puVar4[1];
        *puVar4 = plVar5;
        puVar4[1] = 0;
        *(undefined1 *)(puVar4 + 2) = 0;
        plVar5 = (long *)std::__cxx11::string::append((char *)&local_328);
        break;
      default:
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
        goto LAB_00543d9c;
      }
      goto LAB_00543608;
    }
    switch(*(undefined4 *)((long)this + 0x84)) {
    case 0:
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1c8);
      std::ostream::operator<<(local_1c8,numUsedBindings);
      std::__cxx11::stringbuf::str();
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1c8);
      std::ios_base::~ios_base(local_158);
      puVar4 = (undefined8 *)std::__cxx11::string::replace((ulong)&local_2c8,0,(char *)0x0,0xb1b47c)
      ;
      local_2a8 = &local_298;
      puVar6 = puVar4 + 2;
      if ((ulong *)*puVar4 == puVar6) {
        local_298 = *puVar6;
        uStack_290 = puVar4[3];
      }
      else {
        local_298 = *puVar6;
        local_2a8 = (ulong *)*puVar4;
      }
      local_2a0 = puVar4[1];
      *puVar4 = puVar6;
      puVar4[1] = 0;
      *(undefined1 *)(puVar4 + 2) = 0;
      puVar4 = (undefined8 *)std::__cxx11::string::append((char *)&local_2a8);
      local_2e8 = &local_2d8;
      puVar6 = puVar4 + 2;
      if ((ulong *)*puVar4 == puVar6) {
        local_2d8 = *puVar6;
        uStack_2d0 = puVar4[3];
      }
      else {
        local_2d8 = *puVar6;
        local_2e8 = (ulong *)*puVar4;
      }
      local_2e0 = puVar4[1];
      *puVar4 = puVar6;
      puVar4[1] = 0;
      *(undefined1 *)(puVar4 + 2) = 0;
      puVar4 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_2e8,(ulong)local_248[0])
      ;
      local_348 = &local_338;
      plVar5 = puVar4 + 2;
      if ((long *)*puVar4 == plVar5) {
        local_338 = *plVar5;
        uStack_330 = puVar4[3];
      }
      else {
        local_338 = *plVar5;
        local_348 = (long *)*puVar4;
      }
      local_340 = puVar4[1];
      *puVar4 = plVar5;
      puVar4[1] = 0;
      *(undefined1 *)(puVar4 + 2) = 0;
      puVar4 = (undefined8 *)std::__cxx11::string::append((char *)&local_348);
      puVar6 = puVar4 + 2;
      if ((ulong *)*puVar4 == puVar6) {
        local_2f8 = *puVar6;
        lStack_2f0 = puVar4[3];
        local_308 = &local_2f8;
      }
      else {
        local_2f8 = *puVar6;
        local_308 = (ulong *)*puVar4;
      }
      local_300 = puVar4[1];
      *puVar4 = puVar6;
      puVar4[1] = 0;
      *(undefined1 *)(puVar4 + 2) = 0;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1c8);
      std::ostream::operator<<(local_1c8,numUsedBindings + 1);
      std::__cxx11::stringbuf::str();
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1c8);
      std::ios_base::~ios_base(local_158);
      uVar9 = 0xf;
      if (local_308 != &local_2f8) {
        uVar9 = local_2f8;
      }
      if (uVar9 < (ulong)(local_280 + local_300)) {
        uVar9 = 0xf;
        if (local_288 != &local_278) {
          uVar9 = local_278;
        }
        if (uVar9 < (ulong)(local_280 + local_300)) goto LAB_005438a4;
        puVar4 = (undefined8 *)
                 std::__cxx11::string::replace((ulong)&local_288,0,(char *)0x0,(ulong)local_308);
      }
      else {
LAB_005438a4:
        puVar4 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_308,(ulong)local_288);
      }
      local_328 = &local_318;
      plVar5 = puVar4 + 2;
      if ((long *)*puVar4 == plVar5) {
        local_318 = *plVar5;
        uStack_310 = puVar4[3];
      }
      else {
        local_318 = *plVar5;
        local_328 = (long *)*puVar4;
      }
      local_320 = puVar4[1];
      *puVar4 = plVar5;
      puVar4[1] = 0;
      *(undefined1 *)plVar5 = 0;
      plVar5 = (long *)std::__cxx11::string::append((char *)&local_328);
LAB_00543c97:
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      psVar7 = (size_type *)(plVar5 + 2);
      if ((size_type *)*plVar5 == psVar7) {
        lVar3 = plVar5[3];
        (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar7;
        *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar3;
      }
      else {
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar5;
        (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar7;
      }
      __return_storage_ptr__->_M_string_length = plVar5[1];
      *plVar5 = (long)psVar7;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      if (local_328 != &local_318) {
        operator_delete(local_328,local_318 + 1);
      }
      if (local_288 != &local_278) {
        operator_delete(local_288,local_278 + 1);
      }
      if (local_308 != &local_2f8) {
        operator_delete(local_308,local_2f8 + 1);
      }
      if (local_348 != &local_338) {
        operator_delete(local_348,local_338 + 1);
      }
      if (local_2e8 != &local_2d8) {
        operator_delete(local_2e8,local_2d8 + 1);
      }
      if (local_2a8 != &local_298) {
        operator_delete(local_2a8,local_298 + 1);
      }
      local_218[0] = local_2b8;
      local_228[0] = local_2c8;
      if (local_2c8 == &local_2b8) goto LAB_00543d9c;
      goto LAB_00543d94;
    case 1:
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1c8);
      std::ostream::operator<<(local_1c8,numUsedBindings);
      std::__cxx11::stringbuf::str();
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1c8);
      std::ios_base::~ios_base(local_158);
      puVar4 = (undefined8 *)std::__cxx11::string::replace((ulong)&local_2e8,0,(char *)0x0,0xb1b47c)
      ;
      local_348 = &local_338;
      plVar5 = puVar4 + 2;
      if ((long *)*puVar4 == plVar5) {
        local_338 = *plVar5;
        uStack_330 = puVar4[3];
      }
      else {
        local_338 = *plVar5;
        local_348 = (long *)*puVar4;
      }
      local_340 = puVar4[1];
      *puVar4 = plVar5;
      puVar4[1] = 0;
      *(undefined1 *)(puVar4 + 2) = 0;
      puVar4 = (undefined8 *)std::__cxx11::string::append((char *)&local_348);
      local_308 = &local_2f8;
      puVar6 = puVar4 + 2;
      if ((ulong *)*puVar4 == puVar6) {
        local_2f8 = *puVar6;
        lStack_2f0 = puVar4[3];
      }
      else {
        local_2f8 = *puVar6;
        local_308 = (ulong *)*puVar4;
      }
      local_300 = puVar4[1];
      *puVar4 = puVar6;
      puVar4[1] = 0;
      *(undefined1 *)(puVar4 + 2) = 0;
      puVar4 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_308,(ulong)local_248[0])
      ;
      local_328 = &local_318;
      plVar5 = puVar4 + 2;
      if ((long *)*puVar4 == plVar5) {
        local_318 = *plVar5;
        uStack_310 = puVar4[3];
      }
      else {
        local_318 = *plVar5;
        local_328 = (long *)*puVar4;
      }
      local_320 = puVar4[1];
      *puVar4 = plVar5;
      puVar4[1] = 0;
      *(undefined1 *)(puVar4 + 2) = 0;
      plVar5 = (long *)std::__cxx11::string::append((char *)&local_328);
      break;
    case 2:
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1c8);
      std::ostream::operator<<(local_1c8,numUsedBindings);
      std::__cxx11::stringbuf::str();
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1c8);
      std::ios_base::~ios_base(local_158);
      puVar4 = (undefined8 *)std::__cxx11::string::replace((ulong)&local_2e8,0,(char *)0x0,0xb1b47c)
      ;
      local_348 = &local_338;
      plVar5 = puVar4 + 2;
      if ((long *)*puVar4 == plVar5) {
        local_338 = *plVar5;
        uStack_330 = puVar4[3];
      }
      else {
        local_338 = *plVar5;
        local_348 = (long *)*puVar4;
      }
      local_340 = puVar4[1];
      *puVar4 = plVar5;
      puVar4[1] = 0;
      *(undefined1 *)(puVar4 + 2) = 0;
      puVar4 = (undefined8 *)std::__cxx11::string::append((char *)&local_348);
      local_308 = &local_2f8;
      puVar6 = puVar4 + 2;
      if ((ulong *)*puVar4 == puVar6) {
        local_2f8 = *puVar6;
        lStack_2f0 = puVar4[3];
      }
      else {
        local_2f8 = *puVar6;
        local_308 = (ulong *)*puVar4;
      }
      local_300 = puVar4[1];
      *puVar4 = puVar6;
      puVar4[1] = 0;
      *(undefined1 *)(puVar4 + 2) = 0;
      puVar4 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_308,(ulong)local_1e8);
      local_328 = &local_318;
      plVar5 = puVar4 + 2;
      if ((long *)*puVar4 == plVar5) {
        local_318 = *plVar5;
        uStack_310 = puVar4[3];
      }
      else {
        local_318 = *plVar5;
        local_328 = (long *)*puVar4;
      }
      local_320 = puVar4[1];
      *puVar4 = plVar5;
      puVar4[1] = 0;
      *(undefined1 *)(puVar4 + 2) = 0;
      plVar5 = (long *)std::__cxx11::string::append((char *)&local_328);
      break;
    case 3:
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1c8);
      std::ostream::operator<<(local_1c8,numUsedBindings);
      std::__cxx11::stringbuf::str();
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1c8);
      std::ios_base::~ios_base(local_158);
      puVar4 = (undefined8 *)std::__cxx11::string::replace((ulong)&local_2e8,0,(char *)0x0,0xb1b47c)
      ;
      local_348 = &local_338;
      plVar5 = puVar4 + 2;
      if ((long *)*puVar4 == plVar5) {
        local_338 = *plVar5;
        uStack_330 = puVar4[3];
      }
      else {
        local_338 = *plVar5;
        local_348 = (long *)*puVar4;
      }
      local_340 = puVar4[1];
      *puVar4 = plVar5;
      puVar4[1] = 0;
      *(undefined1 *)(puVar4 + 2) = 0;
      puVar4 = (undefined8 *)std::__cxx11::string::append((char *)&local_348);
      local_308 = &local_2f8;
      puVar6 = puVar4 + 2;
      if ((ulong *)*puVar4 == puVar6) {
        local_2f8 = *puVar6;
        lStack_2f0 = puVar4[3];
      }
      else {
        local_2f8 = *puVar6;
        local_308 = (ulong *)*puVar4;
      }
      local_300 = puVar4[1];
      *puVar4 = puVar6;
      puVar4[1] = 0;
      *(undefined1 *)(puVar4 + 2) = 0;
      puVar4 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_308,(ulong)local_248[0])
      ;
      local_328 = &local_318;
      plVar5 = puVar4 + 2;
      if ((long *)*puVar4 == plVar5) {
        local_318 = *plVar5;
        uStack_310 = puVar4[3];
      }
      else {
        local_318 = *plVar5;
        local_328 = (long *)*puVar4;
      }
      local_320 = puVar4[1];
      *puVar4 = plVar5;
      puVar4[1] = 0;
      *(undefined1 *)(puVar4 + 2) = 0;
      plVar5 = (long *)std::__cxx11::string::append((char *)&local_328);
      break;
    default:
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
      goto LAB_00543d9c;
    }
LAB_00543608:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    psVar7 = (size_type *)(plVar5 + 2);
    if ((size_type *)*plVar5 == psVar7) {
      lVar3 = plVar5[3];
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar7;
      *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar3;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar5;
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar7;
    }
    __return_storage_ptr__->_M_string_length = plVar5[1];
    *plVar5 = (long)psVar7;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    if (local_328 != &local_318) {
      operator_delete(local_328,local_318 + 1);
    }
    if (local_308 != &local_2f8) {
      operator_delete(local_308,local_2f8 + 1);
    }
    if (local_348 != &local_338) {
      operator_delete(local_348,local_338 + 1);
    }
    local_218[0] = local_2d8;
    local_228[0] = local_2e8;
    if (local_2e8 == &local_2d8) goto LAB_00543d9c;
  }
LAB_00543d94:
  operator_delete(local_228[0],local_218[0] + 1);
LAB_00543d9c:
  if (local_248[0] != local_238) {
    operator_delete(local_248[0],local_238[0] + 1);
  }
  if (local_50 != local_40) {
    operator_delete(local_50,local_40[0] + 1);
  }
  if (local_1e8 != local_1d8) {
    operator_delete(local_1e8,local_1d8[0] + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string ImageDescriptorCase::genResourceDeclarations (vk::VkShaderStageFlagBits stage, int numUsedBindings) const
{
	DE_UNREF(stage);

	// Vulkan-style resources are arrays implicitly, OpenGL-style are not
	const std::string	dimensionBase	= (m_viewType == vk::VK_IMAGE_VIEW_TYPE_1D || m_viewType == vk::VK_IMAGE_VIEW_TYPE_1D_ARRAY)		? ("1D")
										: (m_viewType == vk::VK_IMAGE_VIEW_TYPE_2D || m_viewType == vk::VK_IMAGE_VIEW_TYPE_2D_ARRAY)		? ("2D")
										: (m_viewType == vk::VK_IMAGE_VIEW_TYPE_3D)															? ("3D")
										: (m_viewType == vk::VK_IMAGE_VIEW_TYPE_CUBE || m_viewType == vk::VK_IMAGE_VIEW_TYPE_CUBE_ARRAY)	? ("Cube")
										: (DE_NULL);
	const std::string	dimensionArray	= (m_viewType == vk::VK_IMAGE_VIEW_TYPE_1D || m_viewType == vk::VK_IMAGE_VIEW_TYPE_1D_ARRAY)		? ("1DArray")
										: (m_viewType == vk::VK_IMAGE_VIEW_TYPE_2D || m_viewType == vk::VK_IMAGE_VIEW_TYPE_2D_ARRAY)		? ("2DArray")
										: (m_viewType == vk::VK_IMAGE_VIEW_TYPE_3D)															? ("3D")
										: (m_viewType == vk::VK_IMAGE_VIEW_TYPE_CUBE || m_viewType == vk::VK_IMAGE_VIEW_TYPE_CUBE_ARRAY)	? ("CubeArray")
										: (DE_NULL);
	const std::string	dimension		= isImageViewTypeArray(m_viewType) ? dimensionArray : dimensionBase;

	if (m_shaderInterface == SHADER_INPUT_MULTIPLE_DISCONTIGUOUS_DESCRIPTORS)
		DE_ASSERT(m_descriptorType == vk::VK_DESCRIPTOR_TYPE_SAMPLER);

	switch (m_shaderInterface)
	{
		case SHADER_INPUT_SINGLE_DESCRIPTOR:
		{
			switch (m_descriptorType)
			{
				case vk::VK_DESCRIPTOR_TYPE_SAMPLER:
					return "layout(set = 0, binding = " + de::toString(numUsedBindings) + ") uniform highp texture" + dimension + " u_separateTexture;\n"
						   "layout(set = 0, binding = " + de::toString(numUsedBindings+1) + ") uniform highp sampler u_separateSampler;\n";
				case vk::VK_DESCRIPTOR_TYPE_COMBINED_IMAGE_SAMPLER:
					return "layout(set = 0, binding = " + de::toString(numUsedBindings) + ") uniform highp sampler" + dimension + " u_combinedTextureSampler;\n";
				case vk::VK_DESCRIPTOR_TYPE_SAMPLED_IMAGE:
					return "layout(set = 0, binding = " + de::toString(numUsedBindings) + ") uniform highp texture" + dimensionBase + " u_separateTexture;\n";
				case vk::VK_DESCRIPTOR_TYPE_STORAGE_IMAGE:
					return "layout(set = 0, binding = " + de::toString(numUsedBindings) + ", rgba8) readonly uniform highp image" + dimension + " u_image;\n";
				default:
					DE_FATAL("invalid descriptor");
					return "";
			}
		}

		case SHADER_INPUT_MULTIPLE_CONTIGUOUS_DESCRIPTORS:
		case SHADER_INPUT_MULTIPLE_DISCONTIGUOUS_DESCRIPTORS:
			switch (m_descriptorType)
			{
				case vk::VK_DESCRIPTOR_TYPE_SAMPLER:
					if (m_shaderInterface == SHADER_INPUT_MULTIPLE_CONTIGUOUS_DESCRIPTORS)
						return "layout(set = 0, binding = " + de::toString(numUsedBindings) + ") uniform highp texture" + dimension + " u_separateTexture;\n"
								"layout(set = 0, binding = " + de::toString(numUsedBindings+1) + ") uniform highp sampler u_separateSamplerA;\n"
								"layout(set = 0, binding = " + de::toString(numUsedBindings+2) + ") uniform highp sampler u_separateSamplerB;\n";
					else
						return "layout(set = 0, binding = " + de::toString(numUsedBindings) + ") uniform highp sampler u_separateSamplerA;\n"
								"layout(set = 0, binding = " + de::toString(numUsedBindings+1) + ") uniform highp texture" + dimension + " u_separateTexture;\n"
								"layout(set = 0, binding = " + de::toString(numUsedBindings+2) + ") uniform highp sampler u_separateSamplerB;\n";
				case vk::VK_DESCRIPTOR_TYPE_COMBINED_IMAGE_SAMPLER:
					return "layout(set = 0, binding = " + de::toString(numUsedBindings) + ") uniform highp sampler" + dimension + " u_combinedTextureSamplerA;\n"
						   "layout(set = 0, binding = " + de::toString(numUsedBindings+1) + ") uniform highp sampler" + dimension + " u_combinedTextureSamplerB;\n";
				case vk::VK_DESCRIPTOR_TYPE_SAMPLED_IMAGE:
					return "layout(set = 0, binding = " + de::toString(numUsedBindings) + ") uniform highp texture" + dimensionBase + " u_separateTextureA;\n"
						   "layout(set = 0, binding = " + de::toString(numUsedBindings+1) + ") uniform highp texture" + dimensionBase + " u_separateTextureB;\n";
				case vk::VK_DESCRIPTOR_TYPE_STORAGE_IMAGE:
					return "layout(set = 0, binding = " + de::toString(numUsedBindings) + ", rgba8) readonly uniform highp image" + dimension + " u_imageA;\n"
						   "layout(set = 0, binding = " + de::toString(numUsedBindings+1) + ", rgba8) readonly uniform highp image" + dimension + " u_imageB;\n";
				default:
					DE_FATAL("invalid descriptor");
					return "";
			}

		case SHADER_INPUT_DESCRIPTOR_ARRAY:
			switch (m_descriptorType)
			{
				case vk::VK_DESCRIPTOR_TYPE_SAMPLER:
					return "layout(set = 0, binding = " + de::toString(numUsedBindings) + ") uniform highp texture" + dimension + " u_separateTexture;\n"
						   "layout(set = 0, binding = " + de::toString(numUsedBindings+1) + ") uniform highp sampler u_separateSampler[2];\n";
				case vk::VK_DESCRIPTOR_TYPE_COMBINED_IMAGE_SAMPLER:
					return "layout(set = 0, binding = " + de::toString(numUsedBindings) + ") uniform highp sampler" + dimension + " u_combinedTextureSampler[2];\n";
				case vk::VK_DESCRIPTOR_TYPE_SAMPLED_IMAGE:
					return "layout(set = 0, binding = " + de::toString(numUsedBindings) + ") uniform highp texture" + dimensionBase + " u_separateTexture[2];\n";
				case vk::VK_DESCRIPTOR_TYPE_STORAGE_IMAGE:
					return "layout(set = 0, binding = " + de::toString(numUsedBindings) + ", rgba8) readonly uniform highp image" + dimension + " u_image[2];\n";
				default:
					DE_FATAL("invalid descriptor");
					return "";
			}

		default:
			DE_FATAL("Impossible");
			return "";
	}
}